

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O0

Value * __thiscall toml::Value::find(Value *this,string *key)

{
  bool bVar1;
  TokenType TVar2;
  string *psVar3;
  string *in_RSI;
  Value *in_RDI;
  string part;
  Token t;
  Value *current;
  Lexer lexer;
  istringstream ss;
  Token *in_stack_fffffffffffffd68;
  Token *in_stack_fffffffffffffd70;
  Value *in_stack_fffffffffffffd80;
  Value *this_00;
  string local_228 [36];
  int local_204;
  Token local_200;
  Value *local_1c0;
  Lexer local_1a8;
  Value local_198 [24];
  string *local_18;
  Token *local_8;
  
  local_18 = in_RSI;
  bVar1 = is<std::map<std::__cxx11::string,toml::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::Value>>>>
                    ((Value *)in_stack_fffffffffffffd70);
  if (bVar1) {
    this_00 = local_198;
    std::__cxx11::istringstream::istringstream((istringstream *)this_00,local_18,_S_in);
    internal::Lexer::Lexer(&local_1a8,(istream *)this_00);
    local_1c0 = in_RDI;
    do {
      internal::Lexer::nextKeyToken((Lexer *)in_stack_fffffffffffffd68);
      TVar2 = internal::Token::type(&local_200);
      if ((TVar2 == IDENT) || (TVar2 = internal::Token::type(&local_200), TVar2 == STRING)) {
        psVar3 = internal::Token::strValue_abi_cxx11_(&local_200);
        std::__cxx11::string::string(local_228,(string *)psVar3);
        internal::Lexer::nextKeyToken((Lexer *)in_stack_fffffffffffffd68);
        internal::Token::operator=(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
        internal::Token::~Token((Token *)0x18856c);
        TVar2 = internal::Token::type(&local_200);
        if (TVar2 == DOT) {
          in_stack_fffffffffffffd80 = findChild(this_00,(string *)in_stack_fffffffffffffd80);
          local_1c0 = in_stack_fffffffffffffd80;
          if ((in_stack_fffffffffffffd80 == (Value *)0x0) ||
             (bVar1 = is<std::map<std::__cxx11::string,toml::Value,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::Value>>>>
                                ((Value *)in_stack_fffffffffffffd70), !bVar1)) {
            local_8 = (Token *)0x0;
            local_204 = 1;
          }
          else {
            local_204 = 0;
          }
        }
        else {
          TVar2 = internal::Token::type(&local_200);
          if (TVar2 == END_OF_FILE) {
            in_stack_fffffffffffffd70 =
                 (Token *)findChild(this_00,(string *)in_stack_fffffffffffffd80);
            local_204 = 1;
            local_8 = in_stack_fffffffffffffd70;
          }
          else {
            local_8 = (Token *)0x0;
            local_204 = 1;
          }
        }
        std::__cxx11::string::~string(local_228);
      }
      else {
        local_8 = (Token *)0x0;
        local_204 = 1;
      }
      internal::Token::~Token((Token *)0x1886aa);
    } while (local_204 == 0);
    std::__cxx11::istringstream::~istringstream((istringstream *)local_198);
  }
  else {
    local_8 = (Token *)0x0;
  }
  return (Value *)local_8;
}

Assistant:

inline const Value* Value::find(const std::string& key) const
{
    if (!is<Table>())
        return nullptr;

    std::istringstream ss(key);
    internal::Lexer lexer(ss);

    const Value* current = this;
    while (true) {
        internal::Token t = lexer.nextKeyToken();
        if (!(t.type() == internal::TokenType::IDENT || t.type() == internal::TokenType::STRING))
            return nullptr;

        std::string part = t.strValue();
        t = lexer.nextKeyToken();
        if (t.type() == internal::TokenType::DOT) {
            current = current->findChild(part);
            if (!current || !current->is<Table>())
                return nullptr;
        } else if (t.type() == internal::TokenType::END_OF_FILE) {
            return current->findChild(part);
        } else {
            return nullptr;
        }
    }
}